

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,AssetPath *asset)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong local_88;
  size_t i;
  string s;
  string local_58 [8];
  string quote_str;
  string in_s;
  AssetPath *asset_local;
  ostream *ofs_local;
  
  psVar2 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(asset);
  std::__cxx11::string::string((string *)(quote_str.field_2._M_local_buf + 8),(string *)psVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"@",(allocator *)(s.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&i);
    bVar1 = tinyusdz::contains((string *)((long)&quote_str.field_2 + 8),'@');
    if (bVar1) {
      for (local_88 = 0; uVar3 = std::__cxx11::string::length(), local_88 < uVar3;
          local_88 = local_88 + 1) {
        uVar3 = std::__cxx11::string::length();
        if (local_88 + 2 < uVar3) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&quote_str.field_2 + 8));
          if (((*pcVar4 == '@') &&
              (pcVar4 = (char *)std::__cxx11::string::operator[]
                                          ((ulong)((long)&quote_str.field_2 + 8)), *pcVar4 == '@'))
             && (pcVar4 = (char *)std::__cxx11::string::operator[]
                                            ((ulong)((long)&quote_str.field_2 + 8)), *pcVar4 == '@')
             ) {
            std::__cxx11::string::operator+=((string *)&i,"\\@@@");
            local_88 = local_88 + 2;
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&quote_str.field_2 + 8))
            ;
            std::__cxx11::string::operator+=((string *)&i,*pcVar4);
          }
        }
      }
      std::__cxx11::string::operator=(local_58,"@@@");
    }
    else {
      std::__cxx11::string::operator=((string *)&i,(string *)(quote_str.field_2._M_local_buf + 8));
    }
    poVar5 = std::operator<<(ofs,local_58);
    poVar5 = std::operator<<(poVar5,(string *)&i);
    std::operator<<(poVar5,local_58);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string(local_58);
  }
  else {
    std::operator<<(ofs,"@@");
  }
  std::__cxx11::string::~string((string *)(quote_str.field_2._M_local_buf + 8));
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::AssetPath &asset) {
  std::string in_s = asset.GetAssetPath();

  if (in_s.empty()) {
    ofs << "@@";
  } else {
    std::string quote_str = "@";

    std::string s;

    if (tinyusdz::contains(in_s, '@')) {
      // Escape '@@@'(to '\@@@') if the input path contains '@@@'
      for (size_t i = 0; i < in_s.length(); i++) {
        if ((i + 2) < in_s.length()) {
          if (in_s[i] == '@' && in_s[i + 1] == '@' && in_s[i + 2] == '@') {
            s += "\\@@@";
            i += 2;
          } else {
            s += in_s[i];
          }
        }
      }

      quote_str = "@@@";
    } else {
      s = in_s;
    }

    // Do not escape backslash for asset path
    ofs << quote_str << s << quote_str;
  }

  return ofs;
}